

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

DISPOSITION_HANDLE disposition_create(role role_value,delivery_number first_value)

{
  int iVar1;
  DISPOSITION_INSTANCE_TAG DVar2;
  AMQP_VALUE item_value;
  AMQP_VALUE item_value_00;
  int local_2c;
  int result;
  AMQP_VALUE first_amqp_value;
  AMQP_VALUE role_amqp_value;
  DISPOSITION_INSTANCE *disposition_instance;
  delivery_number first_value_local;
  role role_value_local;
  
  role_amqp_value = (AMQP_VALUE)malloc(8);
  if (role_amqp_value != (AMQP_VALUE)0x0) {
    DVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x15);
    *(AMQP_VALUE *)role_amqp_value = DVar2.composite_value;
    if (*(AMQP_VALUE *)role_amqp_value == (AMQP_VALUE)0x0) {
      free(role_amqp_value);
      role_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_2c = 0;
      item_value = amqpvalue_create_role(role_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)role_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_2c = 0x2043;
      }
      item_value_00 = amqpvalue_create_delivery_number(first_value);
      if ((local_2c == 0) &&
         (iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)role_amqp_value,1,item_value_00),
         iVar1 != 0)) {
        local_2c = 0x2048;
      }
      amqpvalue_destroy(item_value);
      amqpvalue_destroy(item_value_00);
      if (local_2c != 0) {
        disposition_destroy((DISPOSITION_HANDLE)role_amqp_value);
        role_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (DISPOSITION_HANDLE)role_amqp_value;
}

Assistant:

DISPOSITION_HANDLE disposition_create(role role_value, delivery_number first_value)
{
    DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)malloc(sizeof(DISPOSITION_INSTANCE));
    if (disposition_instance != NULL)
    {
        disposition_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(21);
        if (disposition_instance->composite_value == NULL)
        {
            free(disposition_instance);
            disposition_instance = NULL;
        }
        else
        {
            AMQP_VALUE role_amqp_value;
            AMQP_VALUE first_amqp_value;
            int result = 0;

            role_amqp_value = amqpvalue_create_role(role_value);
            if ((result == 0) && (amqpvalue_set_composite_item(disposition_instance->composite_value, 0, role_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            first_amqp_value = amqpvalue_create_delivery_number(first_value);
            if ((result == 0) && (amqpvalue_set_composite_item(disposition_instance->composite_value, 1, first_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(role_amqp_value);
            amqpvalue_destroy(first_amqp_value);
            if (result != 0)
            {
                disposition_destroy(disposition_instance);
                disposition_instance = NULL;
            }
        }
    }

    return disposition_instance;
}